

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_bswap(ASMState *as,IRIns *ir)

{
  long lVar1;
  Reg RVar2;
  int iVar3;
  undefined1 *puVar4;
  uint uVar5;
  uint uVar6;
  ASMState *in_RSI;
  long in_RDI;
  Reg dest;
  uint32_t rex;
  int n;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  undefined1 *local_20;
  undefined1 *local_8;
  
  RVar2 = ra_dest(in_RSI,(IRIns *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
  uVar6 = (RVar2 & 7) * 0x1000000 + 0xc80f00fd;
  uVar5 = 0;
  if ((0x604208U >> ((byte)in_RSI->cost[1] & 0x1f) & 1) != 0) {
    uVar5 = 0x80200;
  }
  lVar1 = *(long *)(in_RDI + 0x80);
  iVar3 = (int)(char)uVar6;
  if (iVar3 == -0x3c) {
    *(Reg *)(lVar1 + -4) = (RVar2 >> 3 & 1) * 0x2000 ^ uVar6;
    local_8 = (undefined1 *)(lVar1 + -4);
  }
  else {
    *(uint *)(lVar1 + -4) = uVar6;
    puVar4 = (undefined1 *)(lVar1 + (iVar3 + 1));
    in_stack_ffffffffffffffd4 = (uVar5 >> 1 & 0x104) + 0x40 + (RVar2 >> 3 & 1);
    local_20 = puVar4;
    if (in_stack_ffffffffffffffd4 != 0x40) {
      in_stack_ffffffffffffffd4 = uVar5 >> 0x10 | in_stack_ffffffffffffffd4;
      if (iVar3 == -4) {
        *puVar4 = (char)in_stack_ffffffffffffffd4;
        in_stack_ffffffffffffffd4 = uVar6 >> 8 & 0xff;
      }
      else if ((uVar6 & 0xffffff) == 0x6600fd) {
        *puVar4 = (char)in_stack_ffffffffffffffd4;
        in_stack_ffffffffffffffd4 = 0x66;
      }
      local_20 = puVar4 + -1;
      puVar4[-1] = (char)in_stack_ffffffffffffffd4;
    }
    local_8 = local_20;
  }
  *(undefined1 **)(in_RDI + 0x80) = local_8;
  ra_left((ASMState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
          (Reg)((ulong)in_RDI >> 0x20),(IRRef)in_RDI);
  return;
}

Assistant:

static void asm_bswap(ASMState *as, IRIns *ir)
{
  Reg dest = ra_dest(as, ir, RSET_GPR);
  as->mcp = emit_op(XO_BSWAP + ((dest&7) << 24),
		    REX_64IR(ir, 0), dest, 0, as->mcp, 1);
  ra_left(as, dest, ir->op1);
}